

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdModl(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx->vmState->x86ModlWrap = x86ModlWrap;
  ctx_local._2_1_ = cmd.rB;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,(uint)ctx_local._2_1_ << 3);
  EMIT_OP(&ctx->ctx,o_cqo);
  ctx_local._3_1_ = cmd.rC;
  ctx_local._4_4_ = cmd.argument;
  GenCodeLoadInt64FromPointer(ctx,rECX,rECX,ctx_local._3_1_,ctx_local._4_4_);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  EMIT_OP_REG(&ctx->ctx,o_idiv64,rECX);
  ctx_local._1_1_ = cmd.rA;
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,(uint)ctx_local._1_1_ << 3,rEDX);
  return;
}

Assistant:

void GenCodeCmdModl(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	ctx.vmState->x86ModlWrap = x86ModlWrap;

#if defined(_M_X64)
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, cmd.rB * 8); // Load lhs
	EMIT_OP(ctx.ctx, o_cqo);

	GenCodeLoadInt64FromPointer(ctx, rRCX, rRCX, cmd.rC, cmd.argument);

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_REG(ctx.ctx, o_idiv64, rRCX);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, rRDX); // Store long to target
#else
	// Load long RHS value into EAX:EDX
	x86GenCodeLoadInt64FromPointer(ctx, rEDX, rEAX, rEDX, cmd.rC, cmd.argument);

	EMIT_OP_REG(ctx.ctx, o_push, rEDX);
	EMIT_OP_REG(ctx.ctx, o_push, rEAX);

	// Load long LHS value into EAX:EDX
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rB * 8);
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDX, sDWORD, rREG, cmd.rB * 8 + 4);

	EMIT_OP_REG(ctx.ctx, o_push, rEDX);
	EMIT_OP_REG(ctx.ctx, o_push, rEAX);

	EMIT_OP_ADDR(ctx.ctx, o_call, sDWORD, uintptr_t(&ctx.vmState->x86ModlWrap));
	EMIT_OP_REG_NUM(ctx.ctx, o_add, rESP, 16);

	// Send long in EAX:EDX
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX);
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8 + 4, rEDX);
#endif
}